

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_fxtract_x86_64(CPUX86State *env)

{
  undefined2 uVar1;
  undefined4 uVar2;
  uint64_t uVar3;
  uint uVar4;
  ulong uVar5;
  ushort uVar6;
  FPReg *pFVar7;
  floatx80 fVar8;
  
  uVar4 = env->fpstt;
  pFVar7 = env->fpregs + uVar4;
  uVar3 = (pFVar7->d).low;
  uVar6 = *(ushort *)((long)env->fpregs + (ulong)uVar4 * 0x10 + 8);
  uVar1 = *(undefined2 *)((long)env->fpregs + (ulong)uVar4 * 0x10 + 0xe);
  uVar2 = *(undefined4 *)((long)env->fpregs + (ulong)uVar4 * 0x10 + 10);
  if (((uVar6 & 0x7fff) == 0) && (uVar3 == 0)) {
    fVar8._8_8_ = 0xbfff;
    fVar8.low = 0x8000000000000000;
    fVar8 = floatx80_div_x86_64(fVar8,(floatx80)ZEXT816(0),&env->fp_status);
    (pFVar7->d).low = fVar8.low;
    *(uint16_t *)((long)env->fpregs + (ulong)uVar4 * 0x10 + 8) = fVar8.high;
    uVar4 = env->fpstt - 1 & 7;
    env->fpstt = uVar4;
    env->fptags[uVar4] = '\0';
  }
  else {
    fVar8 = int32_to_floatx80_x86_64((uVar6 & 0x7fff) - 0x3fff,&env->fp_status);
    (pFVar7->d).low = fVar8.low;
    *(uint16_t *)((long)env->fpregs + (ulong)uVar4 * 0x10 + 8) = fVar8.high;
    uVar4 = env->fpstt - 1 & 7;
    env->fpstt = uVar4;
    env->fptags[uVar4] = '\0';
    uVar6 = uVar6 & 0x8000 | 0x3fff;
  }
  uVar5 = (ulong)(uVar4 << 4);
  *(uint64_t *)((long)env->fpregs + uVar5) = uVar3;
  *(ushort *)((long)env->fpregs + uVar5 + 8) = uVar6;
  *(undefined4 *)((long)env->fpregs + uVar5 + 10) = uVar2;
  *(undefined2 *)((long)env->fpregs + uVar5 + 0xe) = uVar1;
  return;
}

Assistant:

void helper_fxtract(CPUX86State *env)
{
    CPU_LDoubleU temp;

    temp.d = ST0;

    if (floatx80_is_zero(ST0)) {
        /* Easy way to generate -inf and raising division by 0 exception */
        floatx80 zero = { 0x0000000000000000LL, 0x0000 };
        floatx80 one  = { 0x8000000000000000LL, 0x3fff };
        ST0 = floatx80_div(floatx80_chs(one), zero,
                           &env->fp_status);
        fpush(env);
        ST0 = temp.d;
    } else {
        int expdif;

        expdif = EXPD(temp) - EXPBIAS;
        /* DP exponent bias */
        ST0 = int32_to_floatx80(expdif, &env->fp_status);
        fpush(env);
        BIASEXPONENT(temp);
        ST0 = temp.d;
    }
}